

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O3

void reportInfo(FILE *file,InfoRecordInt64 *info,HighsFileType file_type)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (file_type == kFull) {
    fprintf((FILE *)file,"\n# %s\n# [type: int64_t]\n%s = %ld\n",
            (info->super_InfoRecord).description._M_dataplus._M_p,
            (info->super_InfoRecord).name._M_dataplus._M_p,*info->value);
    return;
  }
  if (file_type == kMd) {
    pcVar1 = (info->super_InfoRecord).name._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + (info->super_InfoRecord).name._M_string_length);
    highsInsertMdEscapes(&local_68,&local_88);
    _Var2._M_p = local_68._M_dataplus._M_p;
    pcVar1 = (info->super_InfoRecord).description._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,
               pcVar1 + (info->super_InfoRecord).description._M_string_length);
    highsInsertMdEscapes(&local_48,&local_a8);
    fprintf((FILE *)file,"## %s\n- %s\n- Type: long integer\n\n",_Var2._M_p,
            local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return;
  }
  fprintf((FILE *)file,"%-30s = %ld\n",(info->super_InfoRecord).name._M_dataplus._M_p,*info->value);
  return;
}

Assistant:

void reportInfo(FILE* file, const InfoRecordInt64& info,
                const HighsFileType file_type) {
  if (file_type == HighsFileType::kMd) {
    fprintf(file, "## %s\n- %s\n- Type: long integer\n\n",
            highsInsertMdEscapes(info.name).c_str(),
            highsInsertMdEscapes(info.description).c_str());
  } else if (file_type == HighsFileType::kFull) {
    fprintf(file, "\n# %s\n# [type: int64_t]\n%s = %" PRId64 "\n",
            info.description.c_str(), info.name.c_str(), *info.value);
  } else {
    fprintf(file, "%-30s = %" PRId64 "\n", info.name.c_str(), *info.value);
  }
}